

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v5::internal::
     parse_format_string<false,char,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::string>,char>>&>
               (basic_string_view<char> format_str,
               format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
               *handler)

{
  bool bVar1;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *end_00;
  size_t sVar2;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *pfVar3;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *in_RDX;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *in_RDI;
  char c;
  char *p;
  char *end;
  char *begin;
  writer write;
  char local_51;
  undefined7 in_stack_ffffffffffffffb8;
  char in_stack_ffffffffffffffbf;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *in_stack_ffffffffffffffc0;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *this;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *this_00;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *handler_00;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *pfVar4;
  
  pfVar4 = in_RDX;
  end_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
            *)basic_string_view<char>::data((basic_string_view<char> *)&stack0xfffffffffffffff0);
  pfVar3 = end_00;
  sVar2 = basic_string_view<char>::size((basic_string_view<char> *)&stack0xfffffffffffffff0);
  this_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
             *)(&end_00->field_0x0 + sVar2);
  do {
    if (pfVar3 == this_00) {
      return;
    }
    local_51 = in_stack_ffffffffffffffbf;
    this = in_stack_ffffffffffffffc0;
    handler_00 = pfVar3;
    if ((*(char *)pfVar3 != '{') &&
       (bVar1 = find<false,char,char_const*>
                          ((char *)this_00,(char *)pfVar3,
                           (char)((ulong)in_stack_ffffffffffffffc0 >> 0x38),
                           (char **)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8)),
       local_51 = in_stack_ffffffffffffffbf, this = in_stack_ffffffffffffffc0, !bVar1)) {
      parse_format_string<false,_char,_fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>_&>
      ::writer::operator()
                ((writer *)in_stack_ffffffffffffffc0,
                 (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                 (char *)end_00);
      return;
    }
    in_stack_ffffffffffffffc0 = pfVar4;
    parse_format_string<false,_char,_fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>_&>
    ::writer::operator()
              ((writer *)this,(char *)CONCAT17(local_51,in_stack_ffffffffffffffb8),(char *)end_00);
    pfVar3 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
              *)&pfVar3->field_0x1;
    if (pfVar3 == this_00) {
      error_handler::on_error
                ((error_handler *)this,(char *)CONCAT17(local_51,in_stack_ffffffffffffffb8));
      return;
    }
    if (*(char *)pfVar3 == '}') {
      format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
      ::on_arg_id(this_00);
      pfVar4 = in_stack_ffffffffffffffc0;
      format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
      ::on_replacement_field(in_RDI,(char *)in_stack_ffffffffffffffc0);
      in_stack_ffffffffffffffc0 = this;
    }
    else {
      pfVar4 = in_stack_ffffffffffffffc0;
      if (*(char *)pfVar3 == '{') {
        format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
        ::on_text(in_RDX,(char *)handler_00,(char *)this_00);
        in_stack_ffffffffffffffc0 = this;
      }
      else {
        pfVar3 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
                  *)parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::string>,char>>&,char>>
                              ((char *)in_stack_ffffffffffffffc0,(char *)in_RDX,
                               (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>_&,_char>
                                *)handler_00);
        if (pfVar3 == this_00) {
          local_51 = '\0';
        }
        else {
          local_51 = *(char *)pfVar3;
        }
        if (local_51 == '}') {
          format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
          ::on_replacement_field(in_RDI,(char *)pfVar4);
        }
        else {
          if (local_51 != ':') {
            error_handler::on_error
                      ((error_handler *)in_stack_ffffffffffffffc0,
                       (char *)CONCAT17(local_51,in_stack_ffffffffffffffb8));
            return;
          }
          pfVar3 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
                    *)format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
                      ::on_format_specs(write.handler_,begin,end);
          if ((pfVar3 == this_00) || (*(char *)pfVar3 != '}')) {
            error_handler::on_error
                      ((error_handler *)in_stack_ffffffffffffffc0,
                       (char *)CONCAT17(local_51,in_stack_ffffffffffffffb8));
            return;
          }
        }
      }
    }
    pfVar3 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
              *)&pfVar3->field_0x1;
    in_stack_ffffffffffffffbf = local_51;
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}